

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O3

vector<libtorrent::dht::dht_status,_std::allocator<libtorrent::dht::dht_status>_> * __thiscall
libtorrent::dht::dht_tracker::dht_status
          (vector<libtorrent::dht::dht_status,_std::allocator<libtorrent::dht::dht_status>_>
           *__return_storage_ptr__,dht_tracker *this)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  dht_status local_80;
  
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::dht::dht_status,_std::allocator<libtorrent::dht::dht_status>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::dht::dht_status,_std::allocator<libtorrent::dht::dht_status>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::dht::dht_status,_std::allocator<libtorrent::dht::dht_status>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      dht::node::status(&local_80,(node *)&p_Var1[1]._M_left);
      ::std::vector<libtorrent::dht::dht_status,_std::allocator<libtorrent::dht::dht_status>_>::
      emplace_back<libtorrent::dht::dht_status>(__return_storage_ptr__,&local_80);
      if (local_80.requests.
          super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.requests.
                        super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_80.requests.
                              super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.requests.
                              super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_80.table.
          super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.table.
                        super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_80.table.
                              super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.table.
                              super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      p_Var1 = (_Base_ptr)::std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<lt::dht::dht_status> dht_tracker::dht_status() const
	{
		std::vector<lt::dht::dht_status> ret;
		for (auto const& n : m_nodes)
			ret.emplace_back(n.second.dht.status());
		return ret;
	}